

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void * __thiscall
google::protobuf::internal::ExtensionSet::MutableRawRepeatedField
          (ExtensionSet *this,int number,FieldType field_type,bool packed,FieldDescriptor *desc)

{
  Extension *pEVar1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar2;
  code *pcVar3;
  Arena *pAVar4;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar5;
  
  pVar5 = Insert(this,number);
  pEVar1 = pVar5.first;
  pEVar1->descriptor = desc;
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
  goto switchD_002b7c7f_default;
  pEVar1->is_repeated = true;
  pEVar1->type = field_type;
  pEVar1->is_packed = packed;
  switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)field_type * 4)) {
  case 1:
  case 8:
    pAVar4 = this->arena_;
    if (pAVar4 == (Arena *)0x0) break;
    if (pAVar4->hooks_cookie_ != (void *)0x0) {
      Arena::OnArenaAllocation(pAVar4,(type_info *)&RepeatedField<int>::typeinfo,0x10);
    }
    pcVar3 = arena_destruct_object<google::protobuf::RepeatedField<int>>;
LAB_002b7d7c:
    pRVar2 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)ArenaImpl::AllocateAlignedAndAddCleanup(&pAVar4->impl_,0x10,pcVar3);
    (pRVar2->super_RepeatedPtrFieldBase).arena_ = (Arena *)0x0;
    *(Arena **)&(pRVar2->super_RepeatedPtrFieldBase).current_size_ = pAVar4;
    goto LAB_002b7df3;
  case 2:
    pAVar4 = this->arena_;
    if (pAVar4 != (Arena *)0x0) {
      if (pAVar4->hooks_cookie_ != (void *)0x0) {
        Arena::OnArenaAllocation(pAVar4,(type_info *)&RepeatedField<long>::typeinfo,0x10);
      }
      pcVar3 = arena_destruct_object<google::protobuf::RepeatedField<long>>;
      goto LAB_002b7d7c;
    }
    break;
  case 3:
    pAVar4 = this->arena_;
    if (pAVar4 != (Arena *)0x0) {
      if (pAVar4->hooks_cookie_ != (void *)0x0) {
        Arena::OnArenaAllocation(pAVar4,(type_info *)&RepeatedField<unsigned_int>::typeinfo,0x10);
      }
      pcVar3 = arena_destruct_object<google::protobuf::RepeatedField<unsigned_int>>;
      goto LAB_002b7d7c;
    }
    break;
  case 4:
    pAVar4 = this->arena_;
    if (pAVar4 != (Arena *)0x0) {
      if (pAVar4->hooks_cookie_ != (void *)0x0) {
        Arena::OnArenaAllocation(pAVar4,(type_info *)&RepeatedField<unsigned_long>::typeinfo,0x10);
      }
      pcVar3 = arena_destruct_object<google::protobuf::RepeatedField<unsigned_long>>;
      goto LAB_002b7d7c;
    }
    break;
  case 5:
    pAVar4 = this->arena_;
    if (pAVar4 != (Arena *)0x0) {
      if (pAVar4->hooks_cookie_ != (void *)0x0) {
        Arena::OnArenaAllocation(pAVar4,(type_info *)&RepeatedField<double>::typeinfo,0x10);
      }
      pcVar3 = arena_destruct_object<google::protobuf::RepeatedField<double>>;
      goto LAB_002b7d7c;
    }
    break;
  case 6:
    pAVar4 = this->arena_;
    if (pAVar4 != (Arena *)0x0) {
      if (pAVar4->hooks_cookie_ != (void *)0x0) {
        Arena::OnArenaAllocation(pAVar4,(type_info *)&RepeatedField<float>::typeinfo,0x10);
      }
      pcVar3 = arena_destruct_object<google::protobuf::RepeatedField<float>>;
      goto LAB_002b7d7c;
    }
    break;
  case 7:
    pAVar4 = this->arena_;
    if (pAVar4 != (Arena *)0x0) {
      if (pAVar4->hooks_cookie_ != (void *)0x0) {
        Arena::OnArenaAllocation(pAVar4,(type_info *)&RepeatedField<bool>::typeinfo,0x10);
      }
      pcVar3 = arena_destruct_object<google::protobuf::RepeatedField<bool>>;
      goto LAB_002b7d7c;
    }
    break;
  case 9:
    pAVar4 = this->arena_;
    if (pAVar4 == (Arena *)0x0) {
LAB_002b7ddb:
      pRVar2 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)operator_new(0x18);
      (pRVar2->super_RepeatedPtrFieldBase).arena_ = (Arena *)0x0;
      (pRVar2->super_RepeatedPtrFieldBase).current_size_ = 0;
      (pRVar2->super_RepeatedPtrFieldBase).total_size_ = 0;
      (pRVar2->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
      goto LAB_002b7df3;
    }
    if (pAVar4->hooks_cookie_ != (void *)0x0) {
      Arena::OnArenaAllocation
                (pAVar4,(type_info *)&RepeatedPtrField<std::__cxx11::string>::typeinfo,0x18);
    }
    pcVar3 = arena_destruct_object<google::protobuf::RepeatedPtrField<std::__cxx11::string>>;
    goto LAB_002b7dc2;
  case 10:
    pAVar4 = this->arena_;
    if (pAVar4 == (Arena *)0x0) goto LAB_002b7ddb;
    if (pAVar4->hooks_cookie_ != (void *)0x0) {
      Arena::OnArenaAllocation
                (pAVar4,(type_info *)&RepeatedPtrField<google::protobuf::MessageLite>::typeinfo,0x18
                );
    }
    pcVar3 = 
    arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>;
LAB_002b7dc2:
    pRVar2 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)ArenaImpl::AllocateAlignedAndAddCleanup(&pAVar4->impl_,0x18,pcVar3);
    (pRVar2->super_RepeatedPtrFieldBase).arena_ = pAVar4;
    (pRVar2->super_RepeatedPtrFieldBase).current_size_ = 0;
    (pRVar2->super_RepeatedPtrFieldBase).total_size_ = 0;
    (pRVar2->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
    goto LAB_002b7df3;
  default:
    goto switchD_002b7c7f_default;
  }
  pRVar2 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)operator_new(0x10);
  (pRVar2->super_RepeatedPtrFieldBase).arena_ = (Arena *)0x0;
  (pRVar2->super_RepeatedPtrFieldBase).current_size_ = 0;
  (pRVar2->super_RepeatedPtrFieldBase).total_size_ = 0;
LAB_002b7df3:
  (pEVar1->field_0).repeated_string_value = pRVar2;
switchD_002b7c7f_default:
  return (void *)(pEVar1->field_0).int64_value;
}

Assistant:

void* ExtensionSet::MutableRawRepeatedField(int number, FieldType field_type,
                                            bool packed,
                                            const FieldDescriptor* desc) {
  Extension* extension;

  // We instantiate an empty Repeated{,Ptr}Field if one doesn't exist for this
  // extension.
  if (MaybeNewExtension(number, desc, &extension)) {
    extension->is_repeated = true;
    extension->type = field_type;
    extension->is_packed = packed;

    switch (WireFormatLite::FieldTypeToCppType(
        static_cast<WireFormatLite::FieldType>(field_type))) {
      case WireFormatLite::CPPTYPE_INT32:
        extension->repeated_int32_value =
            Arena::CreateMessage<RepeatedField<int32>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_INT64:
        extension->repeated_int64_value =
            Arena::CreateMessage<RepeatedField<int64>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_UINT32:
        extension->repeated_uint32_value =
            Arena::CreateMessage<RepeatedField<uint32>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_UINT64:
        extension->repeated_uint64_value =
            Arena::CreateMessage<RepeatedField<uint64>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_DOUBLE:
        extension->repeated_double_value =
            Arena::CreateMessage<RepeatedField<double>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_FLOAT:
        extension->repeated_float_value =
            Arena::CreateMessage<RepeatedField<float>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_BOOL:
        extension->repeated_bool_value =
            Arena::CreateMessage<RepeatedField<bool>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_ENUM:
        extension->repeated_enum_value =
            Arena::CreateMessage<RepeatedField<int>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_STRING:
        extension->repeated_string_value =
            Arena::CreateMessage<RepeatedPtrField<std::string>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_MESSAGE:
        extension->repeated_message_value =
            Arena::CreateMessage<RepeatedPtrField<MessageLite>>(arena_);
        break;
    }
  }

  // We assume that all the RepeatedField<>* pointers have the same
  // size and alignment within the anonymous union in Extension.
  return extension->repeated_int32_value;
}